

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeDataSegments(WasmBinaryWriter *this)

{
  pointer puVar1;
  char *data;
  int32_t start;
  U32LEB x;
  ostream *poVar2;
  DataSegment *pDVar3;
  U32LEB x_00;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment;
  pointer puVar4;
  
  puVar4 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != puVar1) {
    if (800000 < (ulong)((long)puVar4 - (long)puVar1)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Some VMs may not accept this binary because it has a large ");
      poVar2 = std::operator<<(poVar2,"number of data segments. Run the limit-segments pass to ");
      std::operator<<(poVar2,"merge segments.\n");
    }
    start = startSection<wasm::BinaryConsts::Section>(this,Data);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)(this->wasm->dataSegments).
                                                                                                        
                                                  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->wasm->dataSegments).
                                                                                                      
                                                  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
    puVar1 = (this->wasm->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->wasm->dataSegments).
                  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      pDVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      x.value = 0;
      x_00.value = 1;
      if (pDVar3->isPassive == false) {
        x.value = getMemoryIndex(this,(Name)(pDVar3->memory).super_IString.str);
        x_00.value = (uint)(x.value != 0) * 2;
      }
      BufferWithRandomAccess::operator<<(this->o,x_00);
      pDVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar3->isPassive == false) {
        if (x.value != 0) {
          BufferWithRandomAccess::operator<<(this->o,x);
          pDVar3 = (puVar4->_M_t).
                   super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                   .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        }
        writeExpression(this,pDVar3->offset);
        BufferWithRandomAccess::operator<<(this->o,'\v');
        pDVar3 = (puVar4->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      }
      data = (pDVar3->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
      writeInlineBuffer(this,data,
                        (long)*(pointer *)
                               ((long)&(pDVar3->data).
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl + 8)
                        - (long)data);
    }
    finishSection(this,start);
    return;
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDataSegments() {
  if (wasm->dataSegments.size() == 0) {
    return;
  }
  if (wasm->dataSegments.size() > WebLimitations::MaxDataSegments) {
    std::cerr << "Some VMs may not accept this binary because it has a large "
              << "number of data segments. Run the limit-segments pass to "
              << "merge segments.\n";
  }
  auto start = startSection(BinaryConsts::Section::Data);
  o << U32LEB(wasm->dataSegments.size());
  for (auto& segment : wasm->dataSegments) {
    uint32_t flags = 0;
    Index memoryIndex = 0;
    if (segment->isPassive) {
      flags |= BinaryConsts::IsPassive;
    } else {
      memoryIndex = getMemoryIndex(segment->memory);
      if (memoryIndex) {
        flags |= BinaryConsts::HasIndex;
      }
    }
    o << U32LEB(flags);
    if (!segment->isPassive) {
      if (memoryIndex) {
        o << U32LEB(memoryIndex);
      }
      writeExpression(segment->offset);
      o << int8_t(BinaryConsts::End);
    }
    writeInlineBuffer(segment->data.data(), segment->data.size());
  }
  finishSection(start);
}